

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermConstantUnion * __thiscall
glslang::HlslParseContext::getSamplePosArray(HlslParseContext *this,int count)

{
  TConstUnionArray *this_00;
  TConstUnion *pTVar1;
  TIntermConstantUnion *this_01;
  undefined4 in_register_00000034;
  TArraySizes *this_02;
  TArraySizes *arraySizes;
  TType retType;
  TConstUnion y;
  TConstUnion x;
  int pos;
  TConstUnionArray *values;
  tSamplePos *ptStack_20;
  int numSamples;
  tSamplePos *sampleLoc;
  int count_local;
  HlslParseContext *this_local;
  
  values._4_4_ = count;
  switch(count) {
  case 2:
    ptStack_20 = getSamplePosArray::pos2;
    break;
  default:
    ptStack_20 = getSamplePosArray::pos1;
    values._4_4_ = 1;
    break;
  case 4:
    ptStack_20 = getSamplePosArray::pos4;
    break;
  case 8:
    ptStack_20 = getSamplePosArray::pos8;
    break;
  case 0x10:
    ptStack_20 = getSamplePosArray::pos16;
  }
  this_00 = (TConstUnionArray *)
            TConstUnionArray::operator_new
                      ((TConstUnionArray *)0x10,CONCAT44(in_register_00000034,count));
  TConstUnionArray::TConstUnionArray(this_00,values._4_4_ << 1);
  for (x._12_4_ = 0; (int)x._12_4_ < count; x._12_4_ = x._12_4_ + 1) {
    TConstUnion::TConstUnion((TConstUnion *)&y.type);
    TConstUnion::TConstUnion((TConstUnion *)&retType.spirvType);
    TConstUnion::setDConst((TConstUnion *)&y.type,(double)ptStack_20[(int)x._12_4_].x);
    TConstUnion::setDConst((TConstUnion *)&retType.spirvType,(double)ptStack_20[(int)x._12_4_].y);
    pTVar1 = TConstUnionArray::operator[](this_00,(long)(int)(x._12_4_ << 1));
    pTVar1->field_0 = (anon_union_8_11_a9b10978_for_TConstUnion_0)y._8_8_;
    pTVar1->type = x.field_0.iConst;
    pTVar1 = TConstUnionArray::operator[](this_00,(long)(x._12_4_ * 2 + 1));
    (pTVar1->field_0).sConst = (TString *)retType.spirvType;
    pTVar1->type = y.field_0.iConst;
  }
  this_02 = (TArraySizes *)0x1;
  TType::TType((TType *)&arraySizes,EbtFloat,EvqConst,2,0,0,false);
  if (values._4_4_ != 1) {
    this_02 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)this_02);
    TArraySizes::TArraySizes(this_02);
    TArraySizes::addInnerSize(this_02,values._4_4_);
    TType::transferArraySizes((TType *)&arraySizes,this_02);
  }
  this_01 = (TIntermConstantUnion *)TIntermNode::operator_new((TIntermNode *)0xd0,(size_t)this_02);
  TIntermConstantUnion::TIntermConstantUnion(this_01,this_00,(TType *)&arraySizes);
  TType::~TType((TType *)&arraySizes);
  return this_01;
}

Assistant:

TIntermConstantUnion* HlslParseContext::getSamplePosArray(int count)
{
    struct tSamplePos { float x, y; };

    static const tSamplePos pos1[] = {
        { 0.0/16.0,  0.0/16.0 },
    };

    // standard sample positions for 2, 4, 8, and 16 samples.
    static const tSamplePos pos2[] = {
        { 4.0/16.0,  4.0/16.0 }, {-4.0/16.0, -4.0/16.0 },
    };

    static const tSamplePos pos4[] = {
        {-2.0/16.0, -6.0/16.0 }, { 6.0/16.0, -2.0/16.0 }, {-6.0/16.0,  2.0/16.0 }, { 2.0/16.0,  6.0/16.0 },
    };

    static const tSamplePos pos8[] = {
        { 1.0/16.0, -3.0/16.0 }, {-1.0/16.0,  3.0/16.0 }, { 5.0/16.0,  1.0/16.0 }, {-3.0/16.0, -5.0/16.0 },
        {-5.0/16.0,  5.0/16.0 }, {-7.0/16.0, -1.0/16.0 }, { 3.0/16.0,  7.0/16.0 }, { 7.0/16.0, -7.0/16.0 },
    };

    static const tSamplePos pos16[] = {
        { 1.0/16.0,  1.0/16.0 }, {-1.0/16.0, -3.0/16.0 }, {-3.0/16.0,  2.0/16.0 }, { 4.0/16.0, -1.0/16.0 },
        {-5.0/16.0, -2.0/16.0 }, { 2.0/16.0,  5.0/16.0 }, { 5.0/16.0,  3.0/16.0 }, { 3.0/16.0, -5.0/16.0 },
        {-2.0/16.0,  6.0/16.0 }, { 0.0/16.0, -7.0/16.0 }, {-4.0/16.0, -6.0/16.0 }, {-6.0/16.0,  4.0/16.0 },
        {-8.0/16.0,  0.0/16.0 }, { 7.0/16.0, -4.0/16.0 }, { 6.0/16.0,  7.0/16.0 }, {-7.0/16.0, -8.0/16.0 },
    };

    const tSamplePos* sampleLoc = nullptr;
    int numSamples = count;

    switch (count) {
    case 2:  sampleLoc = pos2;  break;
    case 4:  sampleLoc = pos4;  break;
    case 8:  sampleLoc = pos8;  break;
    case 16: sampleLoc = pos16; break;
    default:
        sampleLoc = pos1;
        numSamples = 1;
    }

    TConstUnionArray* values = new TConstUnionArray(numSamples*2);

    for (int pos=0; pos<count; ++pos) {
        TConstUnion x, y;
        x.setDConst(sampleLoc[pos].x);
        y.setDConst(sampleLoc[pos].y);

        (*values)[pos*2+0] = x;
        (*values)[pos*2+1] = y;
    }

    TType retType(EbtFloat, EvqConst, 2);

    if (numSamples != 1) {
        TArraySizes* arraySizes = new TArraySizes;
        arraySizes->addInnerSize(numSamples);
        retType.transferArraySizes(arraySizes);
    }

    return new TIntermConstantUnion(*values, retType);
}